

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

int __thiscall sqlite::Connection::Stmt::bind(Stmt *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined8 uVar2;
  sqlite3 *db;
  char *pcVar3;
  undefined4 uVar4;
  undefined4 in_register_00000034;
  int status;
  char *in_stack_ffffffffffffff20;
  allocator *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  sqlite3_stmt *what;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 uVar6;
  allocator in_stack_ffffffffffffff57;
  string local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar4 = SUB84(__addr,0);
  what = this->stmt_;
  iVar1 = bind_parameter_index
                    ((Stmt *)CONCAT44(in_register_00000034,__fd),
                     (string *)CONCAT44(uVar4,in_stack_ffffffffffffffe8));
  iVar1 = sqlite3_bind_int(what,iVar1,uVar4);
  if (iVar1 != 0) {
    uVar6 = 1;
    uVar2 = __cxa_allocate_exception(0x48);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    db = (sqlite3 *)sqlite3_errmsg(this->db_);
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    pcVar3 = (char *)sqlite3_sql(this->stmt_);
    paVar5 = (allocator *)&stack0xffffffffffffff57;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar3,paVar5);
    Logic_error::Logic_error
              ((Logic_error *)
               CONCAT17(in_stack_ffffffffffffff57,CONCAT16(uVar6,in_stack_ffffffffffffff50)),
               (string *)what,(string *)this,(int)((ulong)uVar2 >> 0x20),db);
    __cxa_throw(uVar2,&Logic_error::typeinfo,Logic_error::~Logic_error);
  }
  return iVar1;
}

Assistant:

void Connection::Stmt::bind(const std::string & name, const int val)
    {
        int status = sqlite3_bind_int(stmt_, bind_parameter_index(name), val);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding " + name +
                ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }